

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers_test.cpp
# Opt level: O2

void flatbuffers::tests::FlexBuffersDeprecatedTest(void)

{
  pointer buf;
  bool expval;
  char *pcVar1;
  TypedVector vec;
  String local_f8;
  string test_data;
  Reference local_c0;
  Builder slb;
  
  flexbuffers::Builder::Builder(&slb,0x100,BUILDER_FLAG_SHARE_KEYS);
  test_data._M_dataplus._M_p = (pointer)&test_data.field_2;
  std::__cxx11::string::_M_construct((ulong)&test_data,',');
  flexbuffers::Builder::String(&slb,&test_data);
  flexbuffers::Builder::String(&slb,"hello");
  flexbuffers::Builder::EndVector
            (&slb,(long)slb.stack_.
                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)slb.stack_.
                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4,true,false);
  flexbuffers::Builder::Finish(&slb);
  flexbuffers::Builder::Finished(&slb);
  buf = slb.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  flexbuffers::Builder::Finished(&slb);
  expval = flexbuffers::VerifyBuffer
                     (buf,(long)slb.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)slb.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
  TestEq<bool,bool>(expval,true,
                    "\'flexbuffers::VerifyBuffer(slb.GetBuffer().data(), slb.GetBuffer().size(), nullptr)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                    ,0xe8,"");
  flexbuffers::Builder::Finished(&slb);
  local_f8.super_Sized.super_Object = (Object)flexbuffers::GetRoot(&slb.buf_);
  flexbuffers::Reference::AsTypedVector(&vec,(Reference *)&local_f8);
  TestEq<flexbuffers::Type,flexbuffers::Type>
            (vec.type_,FBT_KEY,"\'vec.ElementType()\' != \'flexbuffers::FBT_KEY\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xf3,"");
  if (vec.super_Sized.size_ == 0) {
    local_f8.super_Sized.super_Object._8_8_ = 0x101;
    local_f8.super_Sized.super_Object.data_ = (uint8_t *)0x0;
  }
  else {
    local_f8.super_Sized.super_Object._8_8_ =
         (ulong)vec.super_Sized.super_Object.byte_width_ + ((ulong)vec.type_ << 0x20) + 0x100;
    local_f8.super_Sized.super_Object.data_ = vec.super_Sized.super_Object.data_;
  }
  pcVar1 = flexbuffers::Reference::AsKey((Reference *)&local_f8);
  TestEqStr(pcVar1,test_data._M_dataplus._M_p,"\'vec[0].AsKey()\' != \'test_data.c_str()\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
            ,0xf7,"");
  if (vec.super_Sized.size_ == 0) {
    local_c0._8_8_ = 0x101;
    local_c0.data_ = (uint8_t *)0x0;
  }
  else {
    local_c0._8_8_ =
         (ulong)vec.super_Sized.super_Object.byte_width_ + ((ulong)vec.type_ << 0x20) + 0x100;
    local_c0.data_ = vec.super_Sized.super_Object.data_;
  }
  flexbuffers::Reference::AsString(&local_f8,&local_c0);
  TestEqStr((char *)local_f8.super_Sized.super_Object.data_,test_data._M_dataplus._M_p,
            "\'vec[0].AsString().c_str()\' != \'test_data.c_str()\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
            ,0xfa,"");
  if (vec.super_Sized.size_ < 2) {
    local_f8.super_Sized.super_Object._8_8_ = 0x101;
    local_f8.super_Sized.super_Object.data_ = (uint8_t *)0x0;
  }
  else {
    local_f8.super_Sized.super_Object.data_ =
         vec.super_Sized.super_Object.data_ + vec.super_Sized.super_Object.byte_width_;
    local_f8.super_Sized.super_Object._8_8_ =
         (ulong)vec.super_Sized.super_Object.byte_width_ + ((ulong)vec.type_ << 0x20) + 0x100;
  }
  pcVar1 = flexbuffers::Reference::AsKey((Reference *)&local_f8);
  TestEqStr(pcVar1,"hello","\'vec[1].AsKey()\' != \'\"hello\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
            ,0xfc,"");
  if (vec.super_Sized.size_ < 2) {
    local_c0._8_8_ = 0x101;
    local_c0.data_ = (uint8_t *)0x0;
  }
  else {
    local_c0.data_ = vec.super_Sized.super_Object.data_ + vec.super_Sized.super_Object.byte_width_;
    local_c0._8_8_ =
         (ulong)vec.super_Sized.super_Object.byte_width_ + ((ulong)vec.type_ << 0x20) + 0x100;
  }
  flexbuffers::Reference::AsString(&local_f8,&local_c0);
  TestEqStr((char *)local_f8.super_Sized.super_Object.data_,"hello",
            "\'vec[1].AsString().c_str()\' != \'\"hello\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
            ,0xfd,"");
  std::__cxx11::string::~string((string *)&test_data);
  flexbuffers::Builder::~Builder(&slb);
  return;
}

Assistant:

void FlexBuffersDeprecatedTest() {
  // FlexBuffers as originally designed had a flaw involving the
  // FBT_VECTOR_STRING datatype, and this test documents/tests the fix for it.
  // Discussion: https://github.com/google/flatbuffers/issues/5627
  flexbuffers::Builder slb;
  // FBT_VECTOR_* are "typed vectors" where all elements are of the same type.
  // Problem is, when storing FBT_STRING elements, it relies on that type to
  // get the bit-width for the size field of the string, which in this case
  // isn't present, and instead defaults to 8-bit. This means that any strings
  // stored inside such a vector, when accessed thru the old API that returns
  // a String reference, will appear to be truncated if the string stored is
  // actually >=256 bytes.
  std::string test_data(300, 'A');
  auto start = slb.StartVector();
  // This one will have a 16-bit size field.
  slb.String(test_data);
  // This one will have an 8-bit size field.
  slb.String("hello");
  // We're asking this to be serialized as a typed vector (true), but not
  // fixed size (false). The type will be FBT_VECTOR_STRING with a bit-width
  // of whatever the offsets in the vector need, the bit-widths of the strings
  // are not stored(!) <- the actual design flaw.
  // Note that even in the fixed code, we continue to serialize the elements of
  // FBT_VECTOR_STRING as FBT_STRING, since there may be old code out there
  // reading new data that we want to continue to function.
  // Thus, FBT_VECTOR_STRING, while deprecated, will always be represented the
  // same way, the fix lies on the reading side.
  slb.EndVector(start, true, false);
  slb.Finish();
  // Verify because why not.
  TEST_EQ(flexbuffers::VerifyBuffer(slb.GetBuffer().data(),
                                    slb.GetBuffer().size(), nullptr),
          true);
  // So now lets read this data back.
  // For existing data, since we have no way of knowing what the actual
  // bit-width of the size field of the string is, we are going to ignore this
  // field, and instead treat these strings as FBT_KEY (null-terminated), so we
  // can deal with strings of arbitrary length. This of course truncates strings
  // with embedded nulls, but we think that that is preferrable over truncating
  // strings >= 256 bytes.
  auto vec = flexbuffers::GetRoot(slb.GetBuffer()).AsTypedVector();
  // Even though this was serialized as FBT_VECTOR_STRING, it is read as
  // FBT_VECTOR_KEY:
  TEST_EQ(vec.ElementType(), flexbuffers::FBT_KEY);
  // Access the long string. Previously, this would return a string of size 1,
  // since it would read the high-byte of the 16-bit length.
  // This should now correctly test the full 300 bytes, using AsKey():
  TEST_EQ_STR(vec[0].AsKey(), test_data.c_str());
  // Old code that called AsString will continue to work, as the String
  // accessor objects now use a cached size that can come from a key as well.
  TEST_EQ_STR(vec[0].AsString().c_str(), test_data.c_str());
  // Short strings work as before:
  TEST_EQ_STR(vec[1].AsKey(), "hello");
  TEST_EQ_STR(vec[1].AsString().c_str(), "hello");
  // So, while existing code and data mostly "just work" with the fixes applied
  // to AsTypedVector and AsString, what do you do going forward?
  // Code accessing existing data doesn't necessarily need to change, though
  // you could consider using AsKey instead of AsString for a) documenting
  // that you are accessing keys, or b) a speedup if you don't actually use
  // the string size.
  // For new data, or data that doesn't need to be backwards compatible,
  // instead serialize as FBT_VECTOR (call EndVector with typed = false, then
  // read elements with AsString), or, for maximum compactness, use
  // FBT_VECTOR_KEY (call slb.Key above instead, read with AsKey or AsString).
}